

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.hpp
# Opt level: O3

void __thiscall
rudp::rudp_server::
send<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (rudp_server *this,uint32_t session_id,
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          begin,__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                end,function<void_(bool)> *cb)

{
  _Rb_tree_header *p_Var1;
  ulong in_RAX;
  _Base_ptr p_Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  bool *pbVar5;
  bool bVar6;
  undefined8 uStack_28;
  
  p_Var4 = (this->session_bindings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(this->session_bindings)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      bVar6 = p_Var4[1]._M_color < session_id;
      if (!bVar6) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar6];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var2[1]._M_color <= session_id)) {
      uStack_28 = in_RAX;
      iVar3 = std::
              _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>,_std::_Select1st<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>,_std::allocator<std::pair<const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::shared_ptr<rudp::session>_>_>_>
              ::find(&(this->sessions)._M_t,(key_type *)&p_Var2[1].field_0x4);
      if (((_Rb_tree_header *)iVar3._M_node != &(this->sessions)._M_t._M_impl.super__Rb_tree_header)
         && (*(session **)(iVar3._M_node + 2) != (session *)0x0)) {
        session::
        send<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (*(session **)(iVar3._M_node + 2),begin,end,cb);
        return;
      }
      uStack_28._0_7_ = (uint7)(uint6)uStack_28;
      if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0013d0e1;
      pbVar5 = (bool *)((long)&uStack_28 + 6);
      goto LAB_0013d07a;
    }
  }
  uStack_28 = in_RAX & 0xffffffffffffff;
  if ((cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0013d0e1:
    std::__throw_bad_function_call();
  }
  pbVar5 = (bool *)((long)&uStack_28 + 7);
LAB_0013d07a:
  (*cb->_M_invoker)((_Any_data *)cb,pbVar5);
  return;
}

Assistant:

void send(
    uint32_t session_id,
    Iterator begin, Iterator end,
    const std::function< void( bool ) > &cb
  ) {
    auto endpoint = session_bindings.find( session_id );
    if( endpoint != session_bindings.end() ) {
      auto sess = sessions.find( endpoint->second );
      if( sess != sessions.end() && sess->second )
        sess->second->send( begin, end, cb );
      else cb( false );
    }
    else cb( false );
  }